

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O2

void keccak_accumulate(keccak_state *s,void *vdata,size_t len)

{
  uint64_t *puVar1;
  ulong *puVar2;
  ulong uVar3;
  byte bVar4;
  keccak_state *pkVar5;
  uint y;
  long lVar6;
  ulong *puVar7;
  ulong __n;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  undefined1 *puVar14;
  uint (*pauVar15) [5];
  ulong *puVar16;
  uint x;
  void *local_120;
  ulong local_f8 [10];
  undefined1 local_a8 [120];
  
  sVar13 = s->bytes_got;
  local_120 = vdata;
  while( true ) {
    __n = s->bytes_wanted - sVar13;
    if (len < __n) break;
    memcpy(s->bytes + sVar13,local_120,__n);
    uVar8 = 0;
    pkVar5 = s;
    for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
      lVar10 = 0;
      for (; (lVar10 != 0x19 && (uVar8 < s->bytes_wanted)); uVar8 = uVar8 + 8) {
        puVar1 = pkVar5->A[0] + lVar10;
        *puVar1 = *puVar1 ^ *(ulong *)(s->bytes + uVar8);
        lVar10 = lVar10 + 5;
      }
      pkVar5 = (keccak_state *)(pkVar5->A[0] + 1);
    }
    for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 1) {
      puVar7 = local_f8;
      for (uVar8 = 4; uVar8 != 0x1d; uVar8 = uVar8 + 5) {
        puVar16 = (ulong *)((long)(s->A + -1) + 8 + uVar8 * 8);
        puVar2 = (ulong *)((long)(s->A + -1) + 0x18 + uVar8 * 8);
        *puVar7 = puVar2[1] ^ puVar16[1] ^ *puVar2 ^ *puVar16 ^ s->A[0][uVar8];
        puVar7 = puVar7 + 1;
      }
      pkVar5 = s;
      lVar10 = 0;
      while (lVar10 != 5) {
        lVar9 = lVar10 + 1;
        lVar12 = lVar9;
        if (lVar9 == 5) {
          lVar12 = 0;
        }
        uVar8 = local_f8[lVar12];
        uVar11 = (ulong)((int)lVar10 - 1);
        if (lVar10 == 0) {
          uVar11 = 4;
        }
        uVar11 = local_f8[uVar11];
        for (lVar10 = 0; lVar10 != 5; lVar10 = lVar10 + 1) {
          puVar1 = pkVar5->A[0] + lVar10;
          *puVar1 = *puVar1 ^ (uVar8 << 1 | (ulong)((long)uVar8 < 0)) ^ uVar11;
        }
        pkVar5 = (keccak_state *)(pkVar5->A + 1);
        lVar10 = lVar9;
      }
      pauVar15 = rotation_counts;
      uVar8 = 0;
      puVar7 = local_f8;
      pkVar5 = s;
      for (lVar10 = 0; lVar10 != 5; lVar10 = lVar10 + 1) {
        uVar11 = uVar8;
        puVar16 = puVar7;
        for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
          uVar3 = pkVar5->A[0][lVar9];
          bVar4 = (byte)(*pauVar15)[lVar9] & 0x3f;
          puVar16[(uVar11 / 5) * -5] = uVar3 << bVar4 | uVar3 >> 0x40 - bVar4;
          puVar16 = puVar16 + 8;
          uVar11 = uVar11 + 3;
        }
        puVar7 = puVar7 + 2;
        uVar8 = uVar8 + 2;
        pauVar15 = pauVar15 + 1;
        pkVar5 = (keccak_state *)(pkVar5->A + 1);
      }
      puVar7 = local_f8;
      uVar8 = 2;
      puVar14 = local_a8;
      lVar10 = 0;
      pkVar5 = s;
      while (lVar10 != 5) {
        lVar10 = lVar10 + 1;
        lVar9 = lVar10;
        if (lVar10 == 5) {
          lVar9 = 0;
        }
        for (lVar12 = 0; lVar12 != 0x28; lVar12 = lVar12 + 8) {
          *(ulong *)((long)pkVar5->A[0] + lVar12) =
               ~*(ulong *)((long)local_f8 + lVar12 + lVar9 * 0x28) &
               *(ulong *)(puVar14 + lVar12 + (uVar8 / 5) * -200) ^ *(ulong *)((long)puVar7 + lVar12)
          ;
        }
        pkVar5 = (keccak_state *)(pkVar5->A + 1);
        puVar14 = puVar14 + 0x28;
        uVar8 = uVar8 + 1;
        puVar7 = puVar7 + 5;
      }
      s->A[0][0] = s->A[0][0] ^ round_constants[lVar6];
    }
    local_120 = (void *)((long)local_120 + __n);
    smemclr(local_f8,200);
    s->bytes_got = 0;
    sVar13 = 0;
    len = len - __n;
  }
  memcpy(s->bytes + sVar13,local_120,len);
  s->bytes_got = s->bytes_got + len;
  return;
}

Assistant:

static void keccak_accumulate(keccak_state *s, const void *vdata, size_t len)
{
    const unsigned char *data = (const unsigned char *)vdata;

    while (len >= s->bytes_wanted - s->bytes_got) {
        size_t b = s->bytes_wanted - s->bytes_got;
        memcpy(s->bytes + s->bytes_got, data, b);
        len -= b;
        data += b;

        size_t n = 0;
        for (unsigned y = 0; y < 5; y++) {
            for (unsigned x = 0; x < 5; x++) {
                if (n >= s->bytes_wanted)
                    break;

                s->A[x][y] ^= GET_64BIT_LSB_FIRST(s->bytes + n);
                n += 8;
            }
        }
        keccak_transform(s->A);

        s->bytes_got = 0;
    }

    memcpy(s->bytes + s->bytes_got, data, len);
    s->bytes_got += len;
}